

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

bool __thiscall re2::CharClass::Contains(CharClass *this,Rune r)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  ulong uVar6;
  ulong uVar5;
  
  lVar3 = *(long *)(this + 8);
  uVar5 = (ulong)*(uint *)(this + 0x10);
  do {
    iVar4 = (int)uVar5;
    if (iVar4 < 1) break;
    uVar6 = uVar5 >> 1;
    if (*(int *)(lVar3 + 4 + uVar6 * 8) < r) {
      lVar3 = lVar3 + uVar6 * 8 + 8;
      bVar2 = true;
      uVar6 = (ulong)(~(uint)uVar6 + iVar4);
    }
    else {
      iVar1 = *(int *)(lVar3 + uVar6 * 8);
      bVar2 = r < iVar1;
      if (iVar1 <= r) {
        uVar6 = uVar5;
      }
    }
    uVar5 = uVar6;
  } while (bVar2);
  return 0 < iVar4;
}

Assistant:

bool CharClass::Contains(Rune r) {
  RuneRange* rr = ranges_;
  int n = nranges_;
  while (n > 0) {
    int m = n/2;
    if (rr[m].hi < r) {
      rr += m+1;
      n -= m+1;
    } else if (r < rr[m].lo) {
      n = m;
    } else {  // rr[m].lo <= r && r <= rr[m].hi
      return true;
    }
  }
  return false;
}